

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  char *in_stack_00000078;
  
  if (gPropFd == -1) {
    gPropFd = connectToServer(in_stack_00000078);
    return in_EAX;
  }
  __assert_fail("gPropFd == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kiddlu[P]android-init-for-linux/libprop/properties.c"
                ,0x51,"void init(void)");
}

Assistant:

static void init(void)
{
    assert(gPropFd == -1);

    gPropFd = connectToServer(SYSTEM_PROPERTY_PIPE_NAME);
    if (gPropFd < 0) {
        //LOGW("not connected to system property server\n");
    } else {
        //LOGV("Connected to system property server\n");
    }
}